

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_RemoveInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  DObject *this;
  char *pcVar2;
  DObject *this_00;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00430e99;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00430e80:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00430e99:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x35b,
                  "int AF_AActor_RemoveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_00430e04;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00430e99;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_00430e80;
LAB_00430e04:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00430eb8;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00430e89:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00430eb8;
  }
  this_00 = (DObject *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (this_00 == (DObject *)0x0) goto LAB_00430e2d;
  }
  else {
    if (this_00 != (DObject *)0x0) goto LAB_00430e89;
LAB_00430e2d:
    NullParam("\"item\"");
    this_00 = (DObject *)param[1].field_0.field_1.a;
    if (this_00 == (DObject *)0x0) {
      this_00 = (DObject *)0x0;
      goto LAB_00430e64;
    }
  }
  bVar1 = DObject::IsKindOf(this_00,AInventory::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar2 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
LAB_00430eb8:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x35c,
                  "int AF_AActor_RemoveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_00430e64:
  (*this->_vptr_DObject[0x15])(this,this_00);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, RemoveInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	self->RemoveInventory(item);
	return 0;
}